

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteorder.c
# Opt level: O2

ExprInfo expr_info(List *expr,ByteOrder hint,ExprInfo *field_info)

{
  byte bVar1;
  byte bVar2;
  TokenType TVar3;
  ByteOrder BVar4;
  int iVar5;
  ByteSize BVar6;
  char *pcVar7;
  ulong uVar8;
  BOOL BVar9;
  char *fmt;
  ListStruct *expr_00;
  List *expr_01;
  int iVar10;
  ulong uVar11;
  ExprInfo EVar12;
  ulong uStack_150;
  char buf [256];
  
  if (expr == (List *)0x0) {
    BVar9 = FALSE;
    uVar8 = 0;
    goto LAB_0010e922;
  }
  TVar3 = (expr->token).type;
  uVar8 = 2;
  uVar11 = 8;
  uStack_150 = uVar8;
  switch(TVar3) {
  case TOK_FALSE:
  case TOK_TRUE:
  case TOK_CCC:
  case TOK_CCN:
  case TOK_CCV:
  case TOK_CCX:
  case TOK_CCNZ:
switchD_0010e704_caseD_3a:
    BVar9 = FALSE;
    uStack_150 = 0;
    break;
  case TOK_IF:
  case TOK_SWITCH:
  case TOK_AND:
  case TOK_OR:
  case TOK_XOR:
  case TOK_NOT:
  case TOK_EQUAL:
  case TOK_NOT_EQUAL:
  case TOK_GREATER_THAN:
  case TOK_LESS_THAN:
  case TOK_GREATER_OR_EQUAL:
  case TOK_LESS_OR_EQUAL:
  case TOK_AMODE_PTR:
  case TOK_REVERSED_AMODE_PTR:
  case TOK_IDENTIFIER:
  case TOK_LEFT_PAREN:
  case TOK_RIGHT_PAREN:
  case TOK_NOP:
  case TOK_UNION:
  case TOK_INTERSECT:
switchD_0010e6a8_caseD_2:
    pcVar7 = unparse_token(&expr->token,buf);
    fmt = "byteorder.c: Don\'t know how to process endianness/byte size for %s.\n";
LAB_0010e720:
    parse_error(expr,fmt,pcVar7);
switchD_0010e704_caseD_2:
    BVar9 = FALSE;
    uVar8 = 0;
    uStack_150 = 0;
    break;
  case TOK_DEFAULT:
    uVar11 = 4;
LAB_0010e7b3:
    BVar9 = FALSE;
    uStack_150 = uVar11;
    break;
  case TOK_DOLLAR_DATA_REGISTER:
  case TOK_DOLLAR_ADDRESS_REGISTER:
  case TOK_DOLLAR_GENERAL_REGISTER:
  case TOK_DATA_REGISTER:
  case TOK_ADDRESS_REGISTER:
  case TOK_TEMP_REGISTER:
switchD_0010e6a8_caseD_f:
    BVar9 = (BOOL)(expr->token).u.reginfo.sgnd;
    uVar8 = uStack_150;
    uStack_150 = (ulong)(expr->token).u.reginfo.size;
    break;
  case TOK_DOLLAR_AMODE:
  case TOK_DOLLAR_REVERSED_AMODE:
  case TOK_AMODE:
  case TOK_REVERSED_AMODE:
    BVar9 = (BOOL)(expr->token).u.reginfo.sgnd;
    uVar8 = 3;
    uStack_150 = (ulong)(expr->token).u.reginfo.size;
    break;
  case TOK_DOLLAR_NUMBER:
    bVar1 = (expr->token).u.reginfo.which;
    BVar4 = field_info[bVar1].order;
    bVar2 = (expr->token).u.reginfo.size;
    BVar9 = (BOOL)(expr->token).u.reginfo.sgnd;
    uVar8 = (ulong)BVar4;
    uStack_150 = (ulong)bVar2;
    if (field_info[bVar1].size != (uint)bVar2 && field_info[bVar1].size != BS_UNKNOWN) {
      pcVar7 = unparse_token(&expr->token,buf);
      parse_error(expr,"Operand field %s defined with more than one different size! (%d/%d)\n",
                  pcVar7,(ulong)field_info[(expr->token).u.reginfo.which].size,
                  (ulong)(expr->token).u.reginfo.size);
    }
    break;
  case TOK_DOLLAR_AMODE_PTR:
  case TOK_DOLLAR_REVERSED_AMODE_PTR:
    goto switchD_0010e6a8_caseD_15;
  case TOK_QUOTED_STRING:
switchD_0010e6a8_caseD_1c:
    uVar11 = 4;
    goto switchD_0010e6a8_caseD_15;
  case TOK_NUMBER:
    uVar11 = 0;
switchD_0010e6a8_caseD_15:
    BVar9 = TRUE;
    uStack_150 = uVar11;
    break;
  default:
    if (TVar3 == TOK_CODE) goto LAB_0010e7b3;
    if (TVar3 != TOK_LIST) goto switchD_0010e6a8_caseD_2;
    expr = expr->car;
    TVar3 = (expr->token).type;
    if (0x4a < TVar3 - TOK_IF) {
switchD_0010e704_caseD_f:
      pcVar7 = unparse_token(&expr->token,buf);
      fmt = "byteorder.c: Don\'t know how to process endianness/byte size for operator %s.\n";
      goto LAB_0010e720;
    }
    BVar9 = FALSE;
    switch(TVar3) {
    case TOK_IF:
    case TOK_SWITCH:
    case TOK_EXPLICIT_LIST:
    case TOK_LIST:
      goto switchD_0010e704_caseD_2;
    case TOK_DEFAULT:
      uStack_150 = 4;
      break;
    case TOK_AND:
    case TOK_OR:
    case TOK_XOR:
    case TOK_NOT:
    case TOK_EQUAL:
    case TOK_NOT_EQUAL:
    case TOK_GREATER_THAN:
    case TOK_LESS_THAN:
    case TOK_GREATER_OR_EQUAL:
    case TOK_LESS_OR_EQUAL:
      uStack_150 = 1;
      break;
    default:
      goto switchD_0010e704_caseD_f;
    case TOK_SHIFT_LEFT:
    case TOK_SHIFT_RIGHT:
      EVar12 = expr_info(expr->cdr,hint,field_info);
      goto LAB_0010e904;
    case TOK_ASSIGN:
      expr_00 = expr->cdr;
      if ((expr_00->token).type - TOK_CCC < 5) {
        expr_00 = expr_00->cdr;
      }
      EVar12 = expr_info(expr_00,hint,field_info);
      uVar8 = EVar12._0_8_;
LAB_0010e904:
      BVar9 = EVar12.sgnd;
      uStack_150 = EVar12._0_8_ >> 0x20;
      break;
    case TOK_PLUS:
    case TOK_MINUS:
    case TOK_MULTIPLY:
    case TOK_DIVIDE:
    case TOK_MOD:
      BVar6 = expr_list_max_size(expr->cdr,hint,field_info);
      uStack_150 = (ulong)BVar6;
      do {
        expr = expr->cdr;
        if (expr == (List *)0x0) break;
        EVar12 = expr_info(expr,hint,field_info);
      } while (EVar12.sgnd != FALSE);
      BVar9 = (BOOL)(expr == (List *)0x0);
      break;
    case TOK_BITWISE_AND:
    case TOK_BITWISE_OR:
    case TOK_BITWISE_XOR:
    case TOK_BITWISE_NOT:
      BVar9 = TRUE;
      iVar5 = 0;
      iVar10 = 0;
      expr_01 = expr;
      while (expr_01 = expr_01->cdr, expr_01 != (List *)0x0) {
        if ((expr_01->token).type != TOK_NUMBER) {
          EVar12 = expr_info(expr_01,hint,field_info);
          if (EVar12.order == BO_NATIVE) {
            iVar10 = iVar10 + 1;
          }
          else if (EVar12.order == BO_BIG_ENDIAN) {
            iVar5 = iVar5 + 1;
          }
          if (EVar12.sgnd == FALSE) {
            BVar9 = FALSE;
          }
        }
      }
      uStack_150 = (ulong)(iVar10 < iVar5 | 2);
      if (iVar5 == iVar10) {
        uStack_150 = (ulong)hint;
      }
      BVar6 = expr_list_max_size(expr->cdr,hint,field_info);
LAB_0010e860:
      uVar8 = uStack_150;
      uStack_150 = (ulong)BVar6;
      break;
    case TOK_FUNC_CALL:
      goto switchD_0010e6a8_caseD_1c;
    case TOK_CAST:
      goto switchD_0010e704_caseD_3a;
    case TOK_DEREF:
      bVar1 = (expr->token).u.reginfo.size;
      BVar6 = (ByteSize)bVar1;
      uStack_150 = 0;
      if (bVar1 != 0) {
        BVar9 = (BOOL)(expr->token).u.reginfo.sgnd;
        uStack_150 = 3;
        goto LAB_0010e860;
      }
      break;
    case TOK_SWAP:
      EVar12 = expr_info(expr->cdr,hint,field_info);
      uStack_150 = EVar12._0_8_;
      if (EVar12.order == BO_BIG_ENDIAN) {
        uStack_150 = 2;
      }
      else if (EVar12.order == BO_NATIVE) {
        uStack_150 = 3;
      }
      goto switchD_0010e6a8_caseD_f;
    }
  }
  uVar8 = uVar8 & 0xffffffff | uStack_150 << 0x20;
LAB_0010e922:
  EVar12.sgnd = BVar9;
  EVar12.order = (int)uVar8;
  EVar12.size = (int)(uVar8 >> 0x20);
  return EVar12;
}

Assistant:

static ExprInfo
expr_info (const List *expr, ByteOrder hint, ExprInfo *field_info)
{
  ExprInfo info = { BO_UNKNOWN, BS_UNKNOWN, FALSE };   /* Defaults. */
  const Token *t;
  char buf[256];

  if (expr == NULL)
    return info;

  t = &expr->token;
  switch (t->type) {
  case TOK_DATA_REGISTER:
  case TOK_ADDRESS_REGISTER:
  case TOK_TEMP_REGISTER:
    info.order = BO_NATIVE;
    info.size  = t->u.reginfo.size;
    info.sgnd  = t->u.reginfo.sgnd;
    break;

  case TOK_DOLLAR_DATA_REGISTER:
  case TOK_DOLLAR_ADDRESS_REGISTER:
  case TOK_DOLLAR_GENERAL_REGISTER:
    info.order = BO_NATIVE;
    info.size  = t->u.dollarinfo.size;
    info.sgnd  = t->u.dollarinfo.sgnd;
    break;

  case TOK_DOLLAR_AMODE:              /* We assume that by the time we reach */
  case TOK_DOLLAR_REVERSED_AMODE:     /*  here, all reg amodes have been     */
    info.order = BO_BIG_ENDIAN;       /*  converted to dollar_reg's.         */
    info.size  = t->u.dollarinfo.size;
    info.sgnd  = t->u.dollarinfo.sgnd;
    break;

  case TOK_DOLLAR_AMODE_PTR:
  case TOK_DOLLAR_REVERSED_AMODE_PTR:
    info.order = BO_NATIVE;
    info.size  = sizeof (void *);
    info.sgnd  = TRUE;
    break;

  case TOK_AMODE:                     /* We assume that by the time we reach */
  case TOK_REVERSED_AMODE:            /*  here, all reg amodes have been     */
    info.order = BO_BIG_ENDIAN;       /*  converted to dollar_reg's.         */
    info.size  = t->u.amodeinfo.size;
    info.sgnd  = t->u.amodeinfo.sgnd;
    break;

  case TOK_CODE:
    info.order = BO_NATIVE;
    info.size  = sizeof (void *);
    info.sgnd  = FALSE;
    break;

  case TOK_NUMBER:
    info.order = BO_NATIVE;
    info.size  = BS_UNKNOWN;
    info.sgnd  = TRUE;
    break;

  case TOK_DEFAULT:
    info.order = BO_NATIVE;   /* So it's a legal case number. */
    info.size  = BS_LONG;
    info.sgnd  = FALSE;
    break;

  case TOK_CCC:
  case TOK_CCN:
  case TOK_CCV:
  case TOK_CCX:
  case TOK_CCNZ:
    info.order = BO_NATIVE;
#ifdef CCR_ELEMENT_8_BITS
    info.size  = BS_BYTE;
#else
    info.size  = BS_UNKNOWN;
#endif
    info.sgnd  = FALSE;
    break;

  case TOK_DOLLAR_NUMBER:
    info.order = field_info[t->u.dollarinfo.which].order;
    info.size  = t->u.dollarinfo.size;
    info.sgnd  = t->u.dollarinfo.sgnd;
    if (field_info[t->u.dollarinfo.which].size != BS_UNKNOWN
	&& field_info[t->u.dollarinfo.which].size != info.size)
      parse_error (expr, "Operand field %s defined with more than one "
		   "different size! (%d/%d)\n",
		   unparse_token (t, buf),
		   field_info[t->u.dollarinfo.which].size,
		   t->u.dollarinfo.size);
    break;

  case TOK_FALSE:
  case TOK_TRUE:
    info.order = BO_NATIVE;
    info.size  = BS_UNKNOWN;
    info.sgnd  = NO;
    break;

  case TOK_QUOTED_STRING:
    info.order = BO_NATIVE;
    info.size  = BS_LONG;  /* Who knows what is appropriate here. */
    info.sgnd  = TRUE;     /* Sure, why not. */
    break;

  case TOK_LIST:
    expr = expr->car;
    t = &expr->token;
    switch (t->type) {
    case TOK_PLUS:
    case TOK_MINUS:
    case TOK_MULTIPLY:
    case TOK_DIVIDE:
    case TOK_MOD:
      info.order = BO_NATIVE;
      info.size  = expr_list_max_size (expr->cdr, hint, field_info);
      info.sgnd  = !expr_list_any_are_unsigned (expr->cdr, hint, field_info);
      break;

    case TOK_SHIFT_LEFT:
    case TOK_SHIFT_RIGHT:
      info = expr_info (expr->cdr, hint, field_info);  /* Get defaults. */
      info.order = BO_NATIVE;
      break;

    case TOK_BITWISE_AND:
    case TOK_BITWISE_OR:
    case TOK_BITWISE_XOR:
    case TOK_BITWISE_NOT:
      {
	List *l2;
	int big = 0, native = 0;
	info.sgnd = TRUE;
	for (l2 = expr->cdr; l2 != NULL; l2 = l2->cdr)
	  {
	    if (l2->token.type != TOK_NUMBER)
	      {
		ExprInfo info2 = expr_info (l2, hint, field_info);
		if (info2.order == BO_BIG_ENDIAN)
		  big++;
		else if (info2.order == BO_NATIVE)
		  native++;
		if (!info2.sgnd)
		  info.sgnd = FALSE;
	      }
	  }
	if (big == native)  /* Tie?  Then stick with the hint. */
	  info.order = hint;
	else info.order = (big > native) ? BO_BIG_ENDIAN : BO_NATIVE;
	info.size = expr_list_max_size (expr->cdr, hint, field_info);
      }
      break;

    case TOK_SWAP:
      info = expr_info (expr->cdr, hint, field_info);
      if (info.order == BO_BIG_ENDIAN)
	info.order = BO_NATIVE;
      else if (info.order == BO_NATIVE)
	info.order = BO_BIG_ENDIAN;
      info.size = t->u.swapinfo.size;
      info.sgnd = t->u.swapinfo.sgnd;
      break;

    case TOK_LIST:
      /* Stick with "unknown" default. */
      break;

    case TOK_ASSIGN:
#ifndef CCR_ELEMENT_8_BITS
      if (IS_CCBIT_TOKEN (expr->cdr->token.type))
	{
	  info = expr_info (CDDR (expr), hint, field_info);   /* rhs */
	}
      else
#endif
	{
	  info = expr_info (expr->cdr, hint, field_info);     /* lhs */
	}
      break;

    case TOK_CAST:
      info.order = BO_NATIVE;
      info.size  = BS_UNKNOWN;
      info.sgnd = FALSE;  /* Who knows? */
      break;

    case TOK_DEREF:
      if (t->u.derefinfo.size == 0)
	{
	  info.order = BO_NATIVE;
	  info.size  = BS_UNKNOWN;
	  info.sgnd  = FALSE;  /* Who knows? */
	}
      else
	{
	  info.order = BO_BIG_ENDIAN;
	  info.size  = t->u.derefinfo.size;
	  info.sgnd  = t->u.derefinfo.sgnd;
	}
      break;

    case TOK_EQUAL:
    case TOK_NOT_EQUAL:
    case TOK_GREATER_THAN:
    case TOK_LESS_THAN:
    case TOK_GREATER_OR_EQUAL:
    case TOK_LESS_OR_EQUAL:
    case TOK_AND:
    case TOK_OR:
    case TOK_XOR:
    case TOK_NOT:
      info.order = BO_NATIVE;
      info.size  = BS_BYTE;
      info.sgnd  = FALSE;
      break;

    case TOK_SWITCH:
    case TOK_IF:
      break;

    case TOK_DEFAULT:
      info.order = BO_NATIVE;   /* So it's a legal case number. */
      info.size  = BS_LONG;
      info.sgnd  = FALSE;
      break;

    case TOK_EXPLICIT_LIST:   /* Unknown everything. */
      break;

    case TOK_FUNC_CALL:
      info.order = BO_NATIVE;
      info.size  = BS_LONG;
      info.sgnd  = TRUE;  /* Who knows? */
      break;
      
    default:
      parse_error (expr, "byteorder.c: Don't know how to process "
		   "endianness/byte size for operator %s.\n",
		   unparse_token (t, buf));
      break;
    }
    break;

  default:
    parse_error (expr, "byteorder.c: Don't know how to process "
		 "endianness/byte size for %s.\n", unparse_token (t, buf));
    break;
  }

  return info;
}